

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts pick_nan(FloatParts a,FloatParts b,float_status *s)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  FloatClass FVar8;
  FloatParts FVar9;
  
  uVar6 = a._8_8_;
  uVar7 = a.frac;
  uVar4 = b._8_8_;
  uVar5 = b.frac;
  if ((uVar4 & 0xff00000000) == 0x500000000 || a.cls == float_class_snan) {
    s->float_exception_flags = s->float_exception_flags | 1;
  }
  uVar3 = 0x2000000000000000;
  if (s->default_nan_mode != '\0') {
    uVar6 = 0x47fffffff;
    goto LAB_00cfcfbd;
  }
  if (uVar5 < uVar7) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (uVar7 == uVar5) {
      bVar1 = (uint)((uVar4 >> 0x28 & 1) != 0) <= (a._12_4_ >> 8 & 1);
    }
  }
  FVar8 = b.cls;
  uVar3 = uVar7;
  if (a.cls == float_class_snan) {
    bVar2 = FVar8 == float_class_qnan;
    if (FVar8 == float_class_snan) {
      bVar2 = bVar1;
    }
joined_r0x00cfcf92:
    if (bVar2) {
LAB_00cfcf9d:
      uVar6 = uVar4;
      uVar3 = uVar5;
    }
  }
  else {
    if ((a._12_4_ & 0xff) != 4) goto LAB_00cfcf9d;
    if (FVar8 != float_class_snan) {
      bVar2 = (bool)(FVar8 == float_class_qnan & bVar1);
      goto joined_r0x00cfcf92;
    }
  }
  if ((uVar6 & 0xff00000000) == 0x500000000) {
    uVar6 = uVar6 & 0xffffff04ffffffff;
    uVar3 = uVar3 | 0x2000000000000000;
  }
LAB_00cfcfbd:
  FVar9.exp = (int)uVar6;
  FVar9.cls = (char)(uVar6 >> 0x20);
  FVar9.sign = (_Bool)(char)(uVar6 >> 0x28);
  FVar9._14_2_ = (short)(uVar6 >> 0x30);
  FVar9.frac = uVar3;
  return FVar9;
}

Assistant:

static FloatParts pick_nan(FloatParts a, FloatParts b, float_status *s)
{
    if (is_snan(a.cls) || is_snan(b.cls)) {
        s->float_exception_flags |= float_flag_invalid;
    }

    if (s->default_nan_mode) {
        return parts_default_nan(s);
    } else {
        if (pickNaN(a.cls, b.cls,
                    a.frac > b.frac ||
                    (a.frac == b.frac && a.sign < b.sign))) {
            a = b;
        }
        if (is_snan(a.cls)) {
            return parts_silence_nan(a, s);
        }
    }
    return a;
}